

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void runtime::deInitList<std::__cxx11::string>
               (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                *items)

{
  _List_node_base *p_Var1;
  
  while (p_Var1 = (items->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
                  )._M_impl._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)items) {
    p_Var1 = p_Var1[1]._M_next;
    if (p_Var1 != (_List_node_base *)0x0) {
      std::__cxx11::string::~string((string *)p_Var1);
    }
    operator_delete(p_Var1,0x20);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
    ::pop_front(items);
  }
  return;
}

Assistant:

void deInitList(std::list<T*> & items) {
  while (!items.empty()) {
    T* first = items.front();
    delete first;
    items.pop_front();
  }
}